

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::GridProgram::shadeFragments
          (GridProgram *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  int fragNdx_00;
  int packetNdx_00;
  FragmentShadingContext *context_00;
  Vector<float,_4> local_40;
  int local_30;
  int local_2c;
  int fragNdx;
  int packetNdx;
  FragmentShadingContext *context_local;
  FragmentPacket *pFStack_18;
  int numPackets_local;
  FragmentPacket *packets_local;
  GridProgram *this_local;
  
  _fragNdx = context;
  context_local._4_4_ = numPackets;
  pFStack_18 = packets;
  packets_local = (FragmentPacket *)this;
  for (local_2c = 0; local_2c < context_local._4_4_; local_2c = local_2c + 1) {
    for (local_30 = 0; context_00 = _fragNdx, packetNdx_00 = local_2c, fragNdx_00 = local_30,
        local_30 < 4; local_30 = local_30 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_40,pFStack_18 + local_2c,_fragNdx,0,local_30);
      rr::writeFragmentOutput<tcu::Vector<float,4>>(context_00,packetNdx_00,fragNdx_00,0,&local_40);
    }
  }
  return;
}

Assistant:

void GridProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx));
}